

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_split_fs(aec_stream_conflict *strm)

{
  int *piVar1;
  int iVar2;
  internal_state_conflict *piVar3;
  internal_state_conflict *piVar4;
  uint32_t uVar5;
  uint uVar6;
  
  piVar3 = strm->state;
  iVar2 = piVar3->id;
  do {
    uVar5 = fs_ask(strm);
    if (uVar5 == 0) {
      return 0;
    }
    piVar3->rsip[piVar3->sample_counter] = piVar3->fs << ((char)iVar2 - 1U & 0x1f);
    piVar4 = strm->state;
    piVar4->fs = 0;
    piVar1 = &piVar4->bitp;
    *piVar1 = *piVar1 + -1;
    uVar6 = piVar3->sample_counter + 1;
    piVar3->sample_counter = uVar6;
  } while (uVar6 < piVar3->encoded_block_size);
  piVar3->sample_counter = 0;
  piVar3->mode = m_split_output;
  return 1;
}

Assistant:

static int m_split_fs(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (fs_ask(strm) == 0)
            return M_EXIT;
        state->rsip[state->sample_counter] = state->fs << k;
        fs_drop(strm);
    } while(++state->sample_counter < state->encoded_block_size);

    state->sample_counter = 0;
    state->mode = m_split_output;

    return M_CONTINUE;
}